

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbt_pars.cpp
# Opt level: O0

void __thiscall
icu_63::TransliteratorParser::setVariableRange
          (TransliteratorParser *this,int32_t start,int32_t end,UErrorCode *status)

{
  int32_t iVar1;
  UErrorCode *status_local;
  int32_t end_local;
  int32_t start_local;
  TransliteratorParser *this_local;
  
  if (((end < start) || (start < 0)) || (0xffff < end)) {
    *status = U_MALFORMED_PRAGMA;
  }
  else {
    this->curData->variablesBase = (UChar)start;
    iVar1 = UVector::size(&this->dataVector);
    if (iVar1 == 0) {
      this->variableNext = (UChar)start;
      this->variableLimit = (short)end + L'\x01';
    }
  }
  return;
}

Assistant:

void TransliteratorParser::setVariableRange(int32_t start, int32_t end, UErrorCode& status) {
    if (start > end || start < 0 || end > 0xFFFF) {
        status = U_MALFORMED_PRAGMA;
        return;
    }
    
    curData->variablesBase = (UChar) start;
    if (dataVector.size() == 0) {
        variableNext = (UChar) start;
        variableLimit = (UChar) (end + 1);
    }
}